

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::filter_coarsen_improve
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes,Reals *cand_quals
          )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int *piVar2;
  Alloc *pAVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Alloc *this_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  Read<signed_char> RVar6;
  Read<double> vert_old_quals;
  LOs edge_verts2verts;
  Bytes keep_dirs;
  Read<double> cand_old_quals;
  Read<double> edge_old_quals;
  Reals elem_quals;
  Adj verts2elems;
  Alloc *local_1a8;
  element_type *local_1a0;
  Alloc *local_198;
  element_type *peStack_190;
  Read<double> local_180;
  LOs local_170;
  LOs local_160;
  Read<signed_char> local_150;
  Read<double> local_140;
  Alloc *local_130;
  element_type *local_128;
  Read<signed_char> local_120;
  Alloc *local_110;
  element_type *local_108;
  Read<signed_char> local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  element_type *local_d8;
  Read<double> local_d0;
  Graph local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  element_type *local_98;
  Read<signed_char> local_90;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Adj local_60;
  
  Mesh::ask_qualities((Mesh *)&local_a0);
  if ((uint)mesh->dim_ < 4) {
    Mesh::ask_up(&local_60,mesh,0,mesh->dim_);
    local_c0.a2ab.write_.shared_alloc_.alloc = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c0.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_c0.a2ab.write_.shared_alloc_.direct_ptr =
         local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_c0.ab2b.write_.shared_alloc_.alloc = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c0.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_c0.ab2b.write_.shared_alloc_.direct_ptr =
         local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_d0.write_.shared_alloc_.alloc = (Alloc *)local_a0._M_pi;
    if (((ulong)local_a0._M_pi & 7) == 0 && (Alloc *)local_a0._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_a0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_a0._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_a0._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_d0.write_.shared_alloc_.direct_ptr = local_98;
    graph_reduce<double>((Omega_h *)&local_1a8,&local_c0,&local_d0,1,OMEGA_H_MIN);
    pAVar3 = local_d0.write_.shared_alloc_.alloc;
    if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_d0.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_c0.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_c0.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c0.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_c0.ab2b.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_c0.ab2b.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_c0.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_c0.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c0.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_c0.a2ab.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_c0.a2ab.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8->size * 8 + 1);
      }
      else {
        local_1a8->use_count = local_1a8->use_count + 1;
      }
    }
    local_d8 = (element_type *)local_1a0;
    Mesh::sync_array<double>((Mesh *)&local_198,(Int)mesh,(Read<double> *)0x0,(Int)&local_e0);
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      piVar2 = &local_1a8->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_1a8);
        operator_delete(local_1a8,0x48);
      }
    }
    _Var4._M_pi = local_e0._M_pi;
    local_1a8 = local_198;
    local_1a0 = peStack_190;
    if ((((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) && (entering_parallel == '\x01'))
    {
      local_198->use_count = local_198->use_count + -1;
      local_1a8 = (Alloc *)(local_198->size * 8 + 1);
    }
    local_198 = (Alloc *)0x0;
    peStack_190 = (element_type *)0x0;
    if (((ulong)local_e0._M_pi & 7) == 0 && (Alloc *)local_e0._M_pi != (Alloc *)0x0) {
      p_Var1 = local_e0._M_pi + 3;
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_e0._M_pi);
        operator_delete(_Var4._M_pi,0x48);
      }
    }
    Mesh::ask_verts_of((Mesh *)&local_198,(Int)mesh);
    local_160.write_.shared_alloc_.alloc = local_198;
    if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_160.write_.shared_alloc_.alloc = (Alloc *)(local_198->size * 8 + 1);
      }
      else {
        local_198->use_count = local_198->use_count + 1;
      }
    }
    local_160.write_.shared_alloc_.direct_ptr = peStack_190;
    local_100.write_.shared_alloc_.alloc = local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_100.write_.shared_alloc_.alloc = (Alloc *)(local_1a8->size * 8 + 1);
      }
      else {
        local_1a8->use_count = local_1a8->use_count + 1;
      }
    }
    local_100.write_.shared_alloc_.direct_ptr = local_1a0;
    unmap<double>((Omega_h *)&local_70,&local_160,&local_100,1);
    read<double>((Omega_h *)&local_f0,&local_70);
    if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 &&
        local_70.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_70.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_70.shared_alloc_.alloc);
        operator_delete(local_70.shared_alloc_.alloc,0x48);
      }
    }
    pAVar3 = local_100.write_.shared_alloc_.alloc;
    if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
        local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_100.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_160.write_.shared_alloc_.alloc;
    if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
        local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_160.write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_160.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_170.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_170.write_.shared_alloc_.alloc & 7) == 0 &&
        local_170.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_170.write_.shared_alloc_.alloc =
             (Alloc *)((local_170.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_170.write_.shared_alloc_.alloc)->use_count =
             (local_170.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_170.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_120.write_.shared_alloc_.alloc = (Alloc *)local_f0._M_pi;
    if (((ulong)local_f0._M_pi & 7) == 0 && (Alloc *)local_f0._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_120.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_f0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_f0._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_f0._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_120.write_.shared_alloc_.direct_ptr = local_e8;
    unmap<double>((Omega_h *)&local_80,&local_170,&local_120,2);
    read<double>((Omega_h *)&local_110,&local_80);
    if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 &&
        local_80.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_80.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_80.shared_alloc_.alloc);
        operator_delete(local_80.shared_alloc_.alloc,0x48);
      }
    }
    pAVar3 = local_120.write_.shared_alloc_.alloc;
    if (((ulong)local_120.write_.shared_alloc_.alloc & 7) == 0 &&
        local_120.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_120.write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_120.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_170.write_.shared_alloc_.alloc;
    if (((ulong)local_170.write_.shared_alloc_.alloc & 7) == 0 &&
        local_170.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_170.write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_170.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_180.write_.shared_alloc_.alloc = (cand_quals->write_).shared_alloc_.alloc;
    if (((ulong)local_180.write_.shared_alloc_.alloc & 7) == 0 &&
        local_180.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_180.write_.shared_alloc_.alloc =
             (Alloc *)((local_180.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_180.write_.shared_alloc_.alloc)->use_count =
             (local_180.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_180.write_.shared_alloc_.direct_ptr = (cand_quals->write_).shared_alloc_.direct_ptr;
    local_140.write_.shared_alloc_.alloc = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_140.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
      }
      else {
        local_110->use_count = local_110->use_count + 1;
      }
    }
    local_140.write_.shared_alloc_.direct_ptr = local_108;
    gt_each<double>((Omega_h *)&local_130,&local_180,&local_140);
    pAVar3 = local_140.write_.shared_alloc_.alloc;
    if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
        local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_140.write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_180.write_.shared_alloc_.alloc;
    if (((ulong)local_180.write_.shared_alloc_.alloc & 7) == 0 &&
        local_180.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_180.write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_180.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_150.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_150.write_.shared_alloc_.alloc & 7) == 0 &&
        local_150.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_150.write_.shared_alloc_.alloc =
             (Alloc *)((local_150.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_150.write_.shared_alloc_.alloc)->use_count =
             (local_150.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_150.write_.shared_alloc_.alloc;
    local_150.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    local_90.write_.shared_alloc_.alloc = local_130;
    if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90.write_.shared_alloc_.alloc = (Alloc *)(local_130->size * 8 + 1);
      }
      else {
        local_130->use_count = local_130->use_count + 1;
      }
    }
    this_00 = local_90.write_.shared_alloc_.alloc;
    local_90.write_.shared_alloc_.direct_ptr = local_128;
    filter_coarsen_dirs(this,&local_150,&local_90);
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)this_00 + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar2 = &pAVar3->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
      piVar2 = &local_130->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_130);
        operator_delete(local_130,0x48);
      }
    }
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      piVar2 = &local_110->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_110);
        operator_delete(local_110,0x48);
      }
    }
    if (((ulong)local_f0._M_pi & 7) == 0 && (Alloc *)local_f0._M_pi != (Alloc *)0x0) {
      p_Var1 = local_f0._M_pi + 3;
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_f0._M_pi);
        operator_delete(local_f0._M_pi,0x48);
      }
    }
    pAVar3 = local_198;
    if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
      piVar2 = &local_198->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_198);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      piVar2 = &local_1a8->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_1a8);
        operator_delete(pAVar3,0x48);
      }
    }
    Adj::~Adj(&local_60);
    pvVar5 = extraout_RDX;
    if (((ulong)local_a0._M_pi & 7) == 0 && (Alloc *)local_a0._M_pi != (Alloc *)0x0) {
      p_Var1 = local_a0._M_pi + 3;
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_a0._M_pi);
        operator_delete(local_a0._M_pi,0x48);
        pvVar5 = extraout_RDX_00;
      }
    }
    RVar6.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Read<I8> filter_coarsen_improve(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes, Reals cand_quals) {
  auto elem_quals = mesh->ask_qualities();
  auto verts2elems = mesh->ask_up(VERT, mesh->dim());
  auto vert_old_quals = graph_reduce(verts2elems, elem_quals, 1, OMEGA_H_MIN);
  vert_old_quals = mesh->sync_array(VERT, vert_old_quals, 1);
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto edge_old_quals = read(unmap(edge_verts2verts, vert_old_quals, 1));
  auto cand_old_quals = read(unmap(cands2edges, edge_old_quals, 2));
  auto keep_dirs = gt_each(cand_quals, cand_old_quals);
  return filter_coarsen_dirs(cand_codes, keep_dirs);
}